

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

TimeZoneFormat * __thiscall icu_63::SimpleDateFormat::getTimeZoneFormat(SimpleDateFormat *this)

{
  TimeZoneFormat *pTVar1;
  UErrorCode local_14;
  SimpleDateFormat *pSStack_10;
  UErrorCode status;
  SimpleDateFormat *this_local;
  
  local_14 = U_ZERO_ERROR;
  pSStack_10 = this;
  pTVar1 = tzFormat(this,&local_14);
  return pTVar1;
}

Assistant:

const TimeZoneFormat*
SimpleDateFormat::getTimeZoneFormat(void) const {
    // TimeZoneFormat initialization might fail when out of memory.
    // If we always initialize TimeZoneFormat instance, we can return
    // such status there. For now, this implementation lazily instantiates
    // a TimeZoneFormat for performance optimization reasons, but cannot
    // propagate such error (probably just out of memory case) to the caller.
    UErrorCode status = U_ZERO_ERROR;
    return (const TimeZoneFormat*)tzFormat(status);
}